

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

char * __thiscall cmStateSnapshot::GetDefinition(cmStateSnapshot *this,string *name)

{
  StackIter end;
  StackIter begin;
  bool bVar1;
  PointerType pSVar2;
  char *pcVar3;
  PositionType *this_00;
  
  this_00 = &this->Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (bVar1) {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    pcVar3 = cmDefinitions::Get(name,begin,end);
    return pcVar3;
  }
  __assert_fail("this->Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                ,0xcd,"const char *cmStateSnapshot::GetDefinition(const std::string &) const");
}

Assistant:

const char* cmStateSnapshot::GetDefinition(std::string const& name) const
{
  assert(this->Position->Vars.IsValid());
  return cmDefinitions::Get(name, this->Position->Vars, this->Position->Root);
}